

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O1

bool anon_unknown.dwarf_8ee020::EqualDescriptor(string *a,string *b)

{
  long lVar1;
  size_t __n;
  int iVar2;
  long in_FS_OFFSET;
  bool bVar3;
  bool bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (a->_M_string_length < 10) {
    bVar3 = false;
  }
  else {
    bVar3 = (a->_M_dataplus)._M_p[a->_M_string_length - 9] == '#';
  }
  if (b->_M_string_length < 10) {
    bVar4 = false;
  }
  else {
    bVar4 = (b->_M_dataplus)._M_p[b->_M_string_length - 9] == '#';
  }
  if (bVar3 != bVar4) {
    if (bVar3 != false) {
      _GLOBAL__N_1::EqualDescriptor();
    }
    if (bVar4 != false) {
      _GLOBAL__N_1::EqualDescriptor();
    }
  }
  __n = a->_M_string_length;
  if (__n == b->_M_string_length) {
    if (__n == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp((a->_M_dataplus)._M_p,(b->_M_dataplus)._M_p,__n);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool EqualDescriptor(std::string a, std::string b)
{
    bool a_check = (a.size() > 9 && a[a.size() - 9] == '#');
    bool b_check = (b.size() > 9 && b[b.size() - 9] == '#');
    if (a_check != b_check) {
        if (a_check) a = a.substr(0, a.size() - 9);
        if (b_check) b = b.substr(0, b.size() - 9);
    }
    return a == b;
}